

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_reference.h
# Opt level: O0

word_type __thiscall
bv::internal::range_reference::operator_cast_to_unsigned_long
          (range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
           *this)

{
  word_type wVar1;
  const_range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  *unaff_retaddr;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  *in_stack_ffffffffffffffe0;
  
  operator_cast_to_const_range_reference(in_stack_ffffffffffffffe0);
  wVar1 = const_range_reference::operator_cast_to_unsigned_long(unaff_retaddr);
  return wVar1;
}

Assistant:

explicit operator word_type() const {
                return word_type(const_range_reference<C>(*this));
            }